

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::ApprovalMismatchException::format
          (string *__return_storage_ptr__,ApprovalMismatchException *this,string *received,
          string *approved)

{
  ostream *poVar1;
  stringstream s;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  ::std::__cxx11::stringstream::stringstream(asStack_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_198,"Failed Approval: \n",0x12);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Received does not match approved \n",0x22);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_198,"Received : \"",0xc);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,(received->_M_dataplus)._M_p,received->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" \n",3);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Approved : \"",0xc);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(approved->_M_dataplus)._M_p,approved->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(asStack_1a8);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalMismatchException::format(const std::string& received,
                                                  const std::string& approved)
    {
        std::stringstream s;
        s << "Failed Approval: \n"
          << "Received does not match approved \n"
          << "Received : \"" << received << "\" \n"
          << "Approved : \"" << approved << "\"";
        return s.str();
    }